

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

UInt32 RcTree_GetPrice(UInt16 *probs,int numBitLevels,UInt32 symbol,UInt32 *ProbPrices)

{
  UInt32 UVar1;
  uint uVar2;
  
  UVar1 = 0;
  for (uVar2 = symbol | 1 << (numBitLevels & 0x1fU); uVar2 != 1; uVar2 = uVar2 >> 1) {
    UVar1 = UVar1 + ProbPrices
                    [(-(uVar2 & 1) & 0x7f0 ^
                     (uint)*(ushort *)((long)probs + (ulong)(uVar2 & 0xfffffffe))) >> 4];
  }
  return UVar1;
}

Assistant:

static UInt32 RcTree_GetPrice(const CLzmaProb *probs, int numBitLevels, UInt32 symbol, const UInt32 *ProbPrices)
{
  UInt32 price = 0;
  symbol |= (1 << numBitLevels);
  while (symbol != 1)
  {
    price += GET_PRICEa(probs[symbol >> 1], symbol & 1);
    symbol >>= 1;
  }
  return price;
}